

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O1

StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_> *
draco::CreateMeshDecoder
          (StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
           *__return_storage_ptr__,uint8_t method)

{
  MeshEdgebreakerDecoder *this;
  int iVar1;
  undefined7 in_register_00000031;
  long *local_60;
  long local_58;
  long local_50 [2];
  Code local_40;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  iVar1 = (int)CONCAT71(in_register_00000031,method);
  if (iVar1 == 1) {
    this = (MeshEdgebreakerDecoder *)operator_new(0x68);
    MeshEdgebreakerDecoder::MeshEdgebreakerDecoder(this);
  }
  else {
    if (iVar1 != 0) {
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Unsupported encoding method.","");
      local_40 = DRACO_ERROR;
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,local_60,local_58 + (long)local_60);
      (__return_storage_ptr__->status_).code_ = local_40;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->status_).error_msg_,local_38,
                 local_30 + (long)local_38);
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
      super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
      super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl = (MeshDecoder *)0x0;
      if (local_38 != local_28) {
        operator_delete(local_38,local_28[0] + 1);
      }
      if (local_60 == local_50) {
        return __return_storage_ptr__;
      }
      operator_delete(local_60,local_50[0] + 1);
      return __return_storage_ptr__;
    }
    this = (MeshEdgebreakerDecoder *)operator_new(0x60);
    MeshSequentialDecoder::MeshSequentialDecoder((MeshSequentialDecoder *)this);
  }
  (__return_storage_ptr__->status_).code_ = OK;
  (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
  (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
  (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->value_)._M_t.
  super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
  super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
  super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl = &this->super_MeshDecoder;
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<MeshDecoder>> CreateMeshDecoder(uint8_t method) {
  if (method == MESH_SEQUENTIAL_ENCODING) {
    return std::unique_ptr<MeshDecoder>(new MeshSequentialDecoder());
  } else if (method == MESH_EDGEBREAKER_ENCODING) {
    return std::unique_ptr<MeshDecoder>(new MeshEdgebreakerDecoder());
  }
  return Status(Status::DRACO_ERROR, "Unsupported encoding method.");
}